

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

wstring * make_positional_abi_cxx11_(wstring_view format)

{
  wchar_t *pwVar1;
  size_t sVar2;
  ulong uVar3;
  wstring *in_RDI;
  wstring *s;
  allocator local_1a;
  undefined1 local_19;
  basic_string_view<wchar_t> local_18;
  
  local_19 = 0;
  pwVar1 = fmt::v5::basic_string_view<wchar_t>::data(&local_18);
  sVar2 = fmt::v5::basic_string_view<wchar_t>::size(&local_18);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring(in_RDI,pwVar1,sVar2,&local_1a);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_1a);
  uVar3 = std::__cxx11::wstring::find((wchar_t)in_RDI,0x25);
  std::__cxx11::wstring::replace((ulong)in_RDI,uVar3,(wchar_t *)0x1);
  return in_RDI;
}

Assistant:

static std::wstring make_positional(fmt::wstring_view format) {
  std::wstring s(format.data(), format.size());
  s.replace(s.find(L'%'), 1, L"%1$");
  return s;
}